

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::AsyncStreamFd::whenWriteDisconnected(AsyncStreamFd *this)

{
  long in_RSI;
  ForkedPromise<void> *p;
  Promise<void> result;
  ForkedPromise<void> fork;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_48;
  char *local_30;
  char *pcStack_28;
  PromiseFulfiller<void> *local_20;
  
  if (*(char *)(in_RSI + 0x78) == '\x01') {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)this);
  }
  else {
    UnixEventPort::FdObserver::whenWriteDisconnected((FdObserver *)&stack0xffffffffffffffb8);
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
    ;
    pcStack_28 = "whenWriteDisconnected";
    local_20 = (PromiseFulfiller<void> *)0x13000001e0;
    Promise<void>::fork((Promise<void> *)&stack0xffffffffffffffc0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&stack0xffffffffffffffb8);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffb8);
    kj::_::NullableValue<kj::ForkedPromise<void>>::emplace<kj::ForkedPromise<void>>
              ((NullableValue<kj::ForkedPromise<void>> *)(in_RSI + 0x78),
               (ForkedPromise<void> *)&stack0xffffffffffffffc0);
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)local_48.ptr;
    local_48.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&stack0xffffffffffffffb8);
    Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose
              ((Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> *)&stack0xffffffffffffffc0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    KJ_IF_SOME(p, writeDisconnectedPromise) {
      return p.addBranch();
    } else {
      auto fork = observer.whenWriteDisconnected().fork();
      auto result = fork.addBranch();
      writeDisconnectedPromise = kj::mv(fork);
      return kj::mv(result);
    }